

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

int ossl_provider_self_test(OSSL_PROVIDER *prov)

{
  long in_RDI;
  int ret;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(long *)(in_RDI + 0x90) == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = (**(code **)(in_RDI + 0x90))(*(undefined8 *)(in_RDI + 0xd0));
    if (iVar1 == 0) {
      provider_flush_store_cache
                ((OSSL_PROVIDER *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
  }
  return iVar1;
}

Assistant:

int ossl_provider_self_test(const OSSL_PROVIDER *prov)
{
    int ret;

    if (prov->self_test == NULL)
        return 1;
    ret = prov->self_test(prov->provctx);
    if (ret == 0)
        (void)provider_flush_store_cache(prov);
    return ret;
}